

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::csharp::CSharpGenerator::Name_abi_cxx11_
          (string *__return_storage_ptr__,CSharpGenerator *this,FieldDef *field)

{
  undefined1 local_40 [8];
  string name;
  FieldDef *field_local;
  CSharpGenerator *this_local;
  
  name.field_2._8_8_ = field;
  ConvertCase((string *)local_40,(string *)field,kUpperCamel,kSnake);
  EscapeKeyword(__return_storage_ptr__,this,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string Name(const FieldDef &field) const {
    std::string name = ConvertCase(field.name, Case::kUpperCamel);
    return EscapeKeyword(name);
  }